

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::swap(dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
       *this,dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *ht)

{
  type tVar1;
  size_type sVar2;
  pointer ppVar3;
  undefined8 uVar4;
  size_type sVar5;
  size_type sVar6;
  undefined8 uVar7;
  size_type sVar8;
  size_type sVar9;
  float fVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  Settings __tmp;
  
  iVar25 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           super_Hasher.id_;
  iVar26 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           super_Hasher.num_hashes_;
  uVar4 = *(undefined8 *)
           &(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_compares_;
  sVar5 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar6 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar18 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           enlarge_factor_;
  fVar19 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           shrink_factor_;
  bVar20 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           consider_shrink_;
  bVar21 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_empty_;
  bVar22 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_deleted_;
  uVar23 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           field_0x2b;
  uVar24 = (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           num_ht_copies_;
  iVar16 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           super_Hasher.id_;
  iVar17 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           super_Hasher.num_hashes_;
  uVar7 = *(undefined8 *)
           &(ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
            super_Hasher.num_compares_;
  sVar8 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar9 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
          shrink_threshold_;
  fVar10 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           shrink_factor_;
  bVar11 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           consider_shrink_;
  bVar12 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_empty_;
  bVar13 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           use_deleted_;
  uVar14 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           field_0x2b;
  uVar15 = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
           num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.enlarge_factor_
       = (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
         enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
       fVar10;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.consider_shrink_
       = bVar11;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_empty_ =
       bVar12;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_deleted_ =
       bVar13;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.field_0x2b =
       uVar14;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.num_ht_copies_ =
       uVar15;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = sVar8;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = sVar9;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.id_
       = iVar16;
  (this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar17;
  *(undefined8 *)
   &(this->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar7;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.enlarge_factor_ =
       fVar18;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
       fVar19;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       bVar20;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_empty_ =
       bVar21;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.use_deleted_ =
       bVar22;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.field_0x2b =
       uVar23;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.num_ht_copies_ =
       uVar24;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.enlarge_threshold_
       = sVar5;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.shrink_threshold_
       = sVar6;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ =
       iVar25;
  (ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar26;
  *(undefined8 *)
   &(ht->settings).super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.super_Hasher.
    num_compares_ = uVar4;
  tVar1 = (this->key_info).empty_key;
  iVar17 = (this->key_info).super_Hasher.id_;
  iVar25 = (this->key_info).super_Hasher.num_hashes_;
  uVar4 = *(undefined8 *)&(this->key_info).super_Hasher.num_compares_;
  (this->key_info).empty_key = (ht->key_info).empty_key;
  iVar16 = (ht->key_info).super_Hasher.num_hashes_;
  uVar7 = *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_;
  (this->key_info).super_Hasher.id_ = (ht->key_info).super_Hasher.id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar16;
  *(undefined8 *)&(this->key_info).super_Hasher.num_compares_ = uVar7;
  (ht->key_info).empty_key = tVar1;
  (ht->key_info).super_Hasher.id_ = iVar17;
  (ht->key_info).super_Hasher.num_hashes_ = iVar25;
  *(undefined8 *)&(ht->key_info).super_Hasher.num_compares_ = uVar4;
  sVar2 = this->num_deleted;
  this->num_deleted = ht->num_deleted;
  ht->num_deleted = sVar2;
  sVar2 = this->num_elements;
  this->num_elements = ht->num_elements;
  ht->num_elements = sVar2;
  sVar2 = this->num_buckets;
  this->num_buckets = ht->num_buckets;
  ht->num_buckets = sVar2;
  ppVar3 = this->table;
  this->table = ht->table;
  ht->table = ppVar3;
  sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *)this,this->num_buckets);
  sparsehash_internal::sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4> *)ht,ht->num_buckets);
  return;
}

Assistant:

void swap(dense_hashtable& ht) {
    std::swap(settings, ht.settings);
    std::swap(key_info, ht.key_info);
    std::swap(num_deleted, ht.num_deleted);
    std::swap(num_elements, ht.num_elements);
    std::swap(num_buckets, ht.num_buckets);
    std::swap(table, ht.table);
    settings.reset_thresholds(bucket_count());  // also resets consider_shrink
    ht.settings.reset_thresholds(ht.bucket_count());
    // we purposefully don't swap the allocator, which may not be swap-able
  }